

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageFilledEllipse(gdImagePtr im,int mx,int my,int w,int h,int c)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined4 local_88;
  undefined4 local_84;
  int old_y2;
  int i;
  long b;
  long a;
  long ry;
  long rx;
  long r;
  long dy;
  long dx;
  long bq;
  long aq;
  int my2;
  int my1;
  int mx2;
  int mx1;
  int x;
  int c_local;
  int h_local;
  int w_local;
  int my_local;
  int mx_local;
  gdImagePtr im_local;
  
  iVar1 = w >> 1;
  lVar2 = (long)iVar1;
  for (mx2 = mx - iVar1; (long)mx2 <= mx + lVar2; mx2 = mx2 + 1) {
    gdImageSetPixel(im,mx2,my,c);
  }
  my1 = mx - iVar1;
  my2 = mx + iVar1;
  lVar3 = (long)(h >> 1) * (long)(h >> 1);
  rx = lVar2 * lVar3;
  ry = rx * 2;
  a = 0;
  local_88 = -2;
  aq._0_4_ = my;
  aq._4_4_ = my;
  mx2 = iVar1;
  while (0 < mx2) {
    if (0 < rx) {
      aq._4_4_ = aq._4_4_ + 1;
      aq._0_4_ = (int)aq + -1;
      a = lVar2 * lVar2 * 2 + a;
      rx = rx - a;
    }
    if (rx < 1) {
      mx2 = mx2 + -1;
      my1 = my1 + 1;
      my2 = my2 + -1;
      ry = ry + lVar3 * -2;
      rx = ry + rx;
    }
    if (local_88 != (int)aq) {
      for (local_84 = my1; local_84 <= my2; local_84 = local_84 + 1) {
        gdImageSetPixel(im,local_84,aq._4_4_,c);
      }
    }
    if (local_88 != (int)aq) {
      for (local_84 = my1; local_84 <= my2; local_84 = local_84 + 1) {
        gdImageSetPixel(im,local_84,(int)aq,c);
      }
    }
    local_88 = (int)aq;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFilledEllipse (gdImagePtr im, int mx, int my, int w, int h, int c)
{
	int x=0,mx1=0,mx2=0,my1=0,my2=0;
	long aq,bq,dx,dy,r,rx,ry,a,b;
	int i;
	int old_y2;

	a=w>>1;
	b=h>>1;

	for (x = mx-a; x <= mx+a; x++) {
		gdImageSetPixel(im, x, my, c);
	}

	mx1 = mx-a;
	my1 = my;
	mx2 = mx+a;
	my2 = my;

	aq = a * a;
	bq = b * b;
	dx = aq << 1;
	dy = bq << 1;
	r  = a * bq;
	rx = r << 1;
	ry = 0;
	x = a;
	old_y2=-2;
	while (x > 0) {
		if (r > 0) {
			my1++;
			my2--;
			ry +=dx;
			r  -=ry;
		}
		if (r <= 0) {
			x--;
			mx1++;
			mx2--;
			rx -=dy;
			r  +=rx;
		}
		if(old_y2!=my2) {
			for(i=mx1; i<=mx2; i++) {
				gdImageSetPixel(im,i,my1,c);
			}
		}
		if(old_y2!=my2) {
			for(i=mx1; i<=mx2; i++) {
				gdImageSetPixel(im,i,my2,c);
			}
		}
		old_y2 = my2;
	}
}